

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O0

uint32_t __thiscall
ans_smsb_decode::decode_sym(ans_smsb_decode *this,uint64_t *state,uint8_t **in_u8)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint32_t uVar4;
  reference pvVar5;
  ulong uVar6;
  uint8_t **in_RDX;
  dec_entry_smsb *in_RSI;
  long in_RDI;
  uint32_t decoded_sym;
  uint32_t *in_ptr_u32;
  value_type *entry;
  
  uVar6._0_4_ = in_RSI->freq;
  uVar6._4_4_ = in_RSI->offset;
  pvVar5 = std::vector<dec_entry_smsb,_std::allocator<dec_entry_smsb>_>::operator[]
                     ((vector<dec_entry_smsb,_std::allocator<dec_entry_smsb>_> *)(in_RDI + 0x38),
                      uVar6 & *(ulong *)(in_RDI + 0x20));
  uVar1._0_4_ = in_RSI->freq;
  uVar1._4_4_ = in_RSI->offset;
  *(ulong *)in_RSI =
       (ulong)pvVar5->freq * (uVar1 >> ((byte)*(undefined8 *)(in_RDI + 0x28) & 0x3f)) +
       (ulong)pvVar5->offset;
  uVar2._0_4_ = in_RSI->freq;
  uVar2._4_4_ = in_RSI->offset;
  if (uVar2 < *(ulong *)(in_RDI + 0x30)) {
    *in_RDX = *in_RDX + -4;
    lVar3._0_4_ = in_RSI->freq;
    lVar3._4_4_ = in_RSI->offset;
    uVar6 = lVar3 << 0x20 | (ulong)*(uint *)*in_RDX;
    in_RSI->freq = (int)uVar6;
    in_RSI->offset = (int)(uVar6 >> 0x20);
  }
  uVar4 = ans_smsb_undo_mapping(in_RSI,in_RDX);
  return uVar4;
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_smsb_undo_mapping(entry, in_u8);
        return decoded_sym;
    }